

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O3

iterator __thiscall
QJsonObject::insertAt<QStringView>
          (QJsonObject *this,qsizetype pos,QStringView key,QJsonValue *value,bool keyExists)

{
  QCborContainerPrivate *pQVar1;
  long in_FS_OFFSET;
  iterator iVar2;
  QCborValue local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->o).d.ptr;
  if (pQVar1 == (QCborContainerPrivate *)0x0) {
    pQVar1 = (QCborContainerPrivate *)operator_new(0x40);
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
    pQVar1->usedData = 0;
    (pQVar1->data).d.d = (Data *)0x0;
    (pQVar1->data).d.ptr = (char *)0x0;
    (pQVar1->data).d.size = 0;
    (pQVar1->elements).d.d = (Data *)0x0;
    (pQVar1->elements).d.ptr = (Element *)0x0;
    (pQVar1->elements).d.size = 0;
    QExplicitlySharedDataPointer<QCborContainerPrivate>::reset(&this->o,pQVar1);
  }
  else {
    detach(this,((ulong)keyExists ^ 1) + ((ulong)(pQVar1->elements).d.size >> 1));
  }
  pQVar1 = (this->o).d.ptr;
  if (keyExists) {
    QCborValue::fromJsonValue(&local_50,value);
    QCborContainerPrivate::replaceAt(pQVar1,pos + 1,&local_50,CopyContainer);
  }
  else {
    QCborValue::QCborValue(&local_50,key);
    QCborContainerPrivate::insertAt(pQVar1,pos,&local_50,CopyContainer);
    if (local_50.container != (QCborContainerPrivate *)0x0) {
      QCborValue::dispose(&local_50);
    }
    pQVar1 = (this->o).d.ptr;
    QCborValue::fromJsonValue(&local_50,value);
    QCborContainerPrivate::insertAt(pQVar1,pos + 1,&local_50,CopyContainer);
  }
  if (local_50.container != (QCborContainerPrivate *)0x0) {
    QCborValue::dispose(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    iVar2.item.super_QJsonValueConstRef._8_8_ = pos - (pos >> 0x3f) | 1;
    iVar2.item.super_QJsonValueConstRef.d = (this->o).d.ptr;
    return (iterator)iVar2.item.super_QJsonValueConstRef;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject::iterator QJsonObject::insertAt(qsizetype pos, T key, const QJsonValue &value, bool keyExists)
{
    if (o)
        detach(o->elements.size() / 2 + (keyExists ? 0 : 1));
    else
        o = new QCborContainerPrivate;

    if (keyExists) {
        o->replaceAt(pos + 1, QCborValue::fromJsonValue(value));
    } else {
        o->insertAt(pos, key);
        o->insertAt(pos + 1, QCborValue::fromJsonValue(value));
    }
    return {this, pos / 2};
}